

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O1

bool __thiscall DL::DataGroup::isAllNumber(DataGroup *this)

{
  element_type *peVar1;
  pointer pDVar2;
  pointer pDVar3;
  bool bVar4;
  
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pDVar2 = (peVar1->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = *(pointer *)
            ((long)&(peVar1->AnonymousData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pDVar2 == pDVar3) {
    if ((peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
        super__Vector_impl_data._M_start ==
        *(pointer *)
         ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl
                 .super__Vector_impl_data + 8)) {
      return false;
    }
    if (pDVar2 == pDVar3) goto LAB_00108b1c;
  }
  bVar4 = isAllAnonymousNumber(this);
  if (!bVar4) {
    return false;
  }
LAB_00108b1c:
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
               super__Vector_impl_data + 8)) {
    bVar4 = isAllNamedNumber(this);
    return bVar4;
  }
  return true;
}

Assistant:

bool DataGroup::isAllNumber() const
{
	if (mShared->AnonymousData.empty() && mShared->NamedData.empty())
		return false;

	return (mShared->AnonymousData.empty() || isAllAnonymousNumber())
		   && (mShared->NamedData.empty() || isAllNamedNumber());
}